

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digraph.cc
# Opt level: O3

AdjVertex * __thiscall
bidirectional::DiGraph::getAdjVertex
          (AdjVertex *__return_storage_ptr__,DiGraph *this,LemonArc *arc,bool *forward)

{
  uint uVar1;
  pointer pVVar2;
  Value *pVVar3;
  uint *puVar4;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  
  lVar10 = (long)arc->_id;
  pVVar2 = (this->vertices).
           super__Vector_base<bidirectional::Vertex,_std::allocator<bidirectional::Vertex>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar9 = *(long *)&(((vector<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                       *)((long)&(((this->lemon_graph_ptr)._M_t.
                                   super___uniq_ptr_impl<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_lemon::SmartDigraph_*,_std::default_delete<lemon::SmartDigraph>_>
                                   .super__Head_base<0UL,_lemon::SmartDigraph_*,_false>._M_head_impl
                                  )->super_ExtendedSmartDigraphBase).super_SmartDigraphBase + 0x18))
                    ->
                    super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                    )._M_impl;
  lVar5 = lVar9 + 4;
  if (*forward != false) {
    lVar5 = lVar9;
  }
  puVar6 = (uint *)(long)*(int *)(lVar5 + lVar10 * 0x10);
  if (puVar6 < (uint *)((long)(this->vertices).
                              super__Vector_base<bidirectional::Vertex,_std::allocator<bidirectional::Vertex>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 3)) {
    lVar9 = *(long *)&(((Container *)
                       ((long)&(((this->weight_map_ptr)._M_t.
                                 super___uniq_ptr_impl<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_*,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                                 .
                                 super__Head_base<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_*,_false>
                                ._M_head_impl)->
                               super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>_>
                               ).
                               super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>
                       + 0x18))->super__Vector_base<double,_std::allocator<double>_>)._M_impl;
    pVVar3 = *(Value **)
              ((long)&(((this->res_map_ptr)._M_t.
                        super___uniq_ptr_impl<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_*,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_>_>
                        .
                        super__Head_base<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_*,_false>
                       ._M_head_impl)->
                      super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>_>
                      ).
                      super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
              + 0x20);
    __return_storage_ptr__->vertex = pVVar2[(long)puVar6];
    __return_storage_ptr__->weight = *(double *)(lVar9 + lVar10 * 8);
    std::vector<double,_std::allocator<double>_>::vector
              (&__return_storage_ptr__->resource_consumption,pVVar3 + lVar10);
    __return_storage_ptr__->init = true;
    return __return_storage_ptr__;
  }
  pcVar11 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  puVar8 = *(uint **)(pcVar11 + 0x30);
  puVar4 = *(uint **)(pcVar11 + 0x38);
  uVar1 = *puVar6;
  uVar12 = (long)puVar4 - (long)puVar8;
  if (0 < (long)uVar12 >> 5) {
    puVar7 = (uint *)((uVar12 & 0xffffffffffffffe0) + (long)puVar8);
    lVar9 = ((long)uVar12 >> 5) + 1;
    puVar6 = puVar8 + 4;
    do {
      if (puVar6[-3] == uVar1) {
        puVar6 = puVar6 + -4;
        goto LAB_00151f68;
      }
      if (puVar6[-1] == uVar1) {
        puVar6 = puVar6 + -2;
        goto LAB_00151f68;
      }
      if (puVar6[1] == uVar1) goto LAB_00151f68;
      if (puVar6[3] == uVar1) {
        puVar6 = puVar6 + 2;
        goto LAB_00151f68;
      }
      lVar9 = lVar9 + -1;
      puVar6 = puVar6 + 8;
    } while (1 < lVar9);
    uVar12 = (long)puVar4 - (long)puVar7;
    puVar8 = puVar7;
  }
  lVar9 = (long)uVar12 >> 3;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      puVar6 = puVar4;
      if ((lVar9 != 3) || (puVar6 = puVar8, puVar8[1] == uVar1)) goto LAB_00151f68;
      puVar8 = puVar8 + 2;
    }
    puVar6 = puVar8;
    if (puVar8[1] == uVar1) goto LAB_00151f68;
    puVar8 = puVar8 + 2;
  }
  puVar6 = puVar4;
  if (puVar8[1] == uVar1) {
    puVar6 = puVar8;
  }
LAB_00151f68:
  return (AdjVertex *)(ulong)*puVar6;
}

Assistant:

AdjVertex DiGraph::getAdjVertex(const LemonArc& arc, const bool& forward)
    const {
  LemonNode node;
  if (forward) {
    node = head(arc);
  } else {
    node = tail(arc);
  }
  const Vertex&              vertex               = getVertexFromLNode(node);
  const double&              weight               = getWeight(arc);
  const std::vector<double>& resource_consumption = getRes(arc);
  return AdjVertex(vertex, weight, resource_consumption);
}